

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VNew_Serial(sunindextype length)

{
  void *pvVar1;
  realtype *data;
  N_Vector v;
  sunindextype length_local;
  
  length_local = (sunindextype)N_VNewEmpty_Serial(length);
  if ((N_Vector)length_local == (N_Vector)0x0) {
    length_local = 0;
  }
  else if (0 < length) {
    pvVar1 = malloc(length << 3);
    if (pvVar1 == (void *)0x0) {
      N_VDestroy_Serial((N_Vector)length_local);
      length_local = 0;
    }
    else {
      *(undefined4 *)((long)((N_Vector)length_local)->content + 8) = 1;
      *(void **)((long)((N_Vector)length_local)->content + 0x10) = pvVar1;
    }
  }
  return (N_Vector)length_local;
}

Assistant:

N_Vector N_VNew_Serial(sunindextype length)
{
  N_Vector v;
  realtype *data;

  v = NULL;
  v = N_VNewEmpty_Serial(length);
  if (v == NULL) return(NULL);

  /* Create data */
  if (length > 0) {

    /* Allocate memory */
    data = NULL;
    data = (realtype *) malloc(length * sizeof(realtype));
    if(data == NULL) { N_VDestroy_Serial(v); return(NULL); }

    /* Attach data */
    NV_OWN_DATA_S(v) = SUNTRUE;
    NV_DATA_S(v)     = data;

  }

  return(v);
}